

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall doctest::String::compare(String *this,char *other,bool no_case)

{
  char *pcVar1;
  bool no_case_local;
  char *other_local;
  String *this_local;
  
  if (no_case) {
    pcVar1 = c_str(this);
    this_local._4_4_ = anon_unknown_14::stricmp(pcVar1,other);
  }
  else {
    pcVar1 = c_str(this);
    this_local._4_4_ = strcmp(pcVar1,other);
  }
  return this_local._4_4_;
}

Assistant:

int String::compare(const char* other, bool no_case) const {
    if(no_case)
        return doctest::stricmp(c_str(), other);
    return std::strcmp(c_str(), other);
}